

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np2_opna.cpp
# Opt level: O0

void __thiscall NP2OPNA<FM::OPNA>::NP2OPNA(NP2OPNA<FM::OPNA> *this,OPNFamily f)

{
  OPNA *this_00;
  OPNA *opn;
  OPNFamily f_local;
  NP2OPNA<FM::OPNA> *this_local;
  
  OPNChipBaseBufferedT<NP2OPNA<FM::OPNA>,_256U>::OPNChipBaseBufferedT
            (&this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNA>,_256U>,f);
  (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNA>,_256U>).super_OPNChipBaseT<NP2OPNA<FM::OPNA>_>
  .super_OPNChipBase._vptr_OPNChipBase = (_func_int **)&PTR__NP2OPNA_002fb5b0;
  this_00 = (OPNA *)calloc(1,0x1490);
  FM::OPNA::OPNA(this_00);
  this->chip = this_00;
  FM::OPNA::Init(this_00,(this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNA>,_256U>).
                         super_OPNChipBaseT<NP2OPNA<FM::OPNA>_>.super_OPNChipBase.m_clock,
                 (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNA>,_256U>).
                 super_OPNChipBaseT<NP2OPNA<FM::OPNA>_>.super_OPNChipBase.m_rate,false,(char *)0x0);
  FM::OPNA::SetReg(this_00,0x29,0x9f);
  return;
}

Assistant:

NP2OPNA<ChipType>::NP2OPNA(OPNFamily f)
    : ChipBase(f)
{
    ChipType *opn = (ChipType *)std::calloc(1, sizeof(ChipType));
    chip = new(opn) ChipType;
    opn->Init(ChipBase::m_clock, ChipBase::m_rate);
    opn->SetReg(0x29, 0x9f);  // enable channels 4-6
}